

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O3

void __thiscall BlurayHelper::setVolumeLabel(BlurayHelper *this,string *label)

{
  IsoWriter *this_00;
  string local_30;
  
  this_00 = this->m_isoWriter;
  if (this_00 != (IsoWriter *)0x0) {
    unquoteStr(&local_30,label);
    IsoWriter::setVolumeLabel(this_00,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void BlurayHelper::setVolumeLabel(const std::string& label) const
{
    if (m_isoWriter)
        m_isoWriter->setVolumeLabel(unquoteStr(label));
}